

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_mod_2d(mp_int *a,int b,mp_int *c)

{
  undefined1 auVar1 [12];
  int iVar2;
  mp_int *in_RDX;
  int in_ESI;
  int *in_RDI;
  int res;
  int x;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_ESI < 1) {
    mp_zero(in_RDX);
    local_4 = 0;
  }
  else if (SBORROW4(in_ESI,*in_RDI * 0x3c) == in_ESI + *in_RDI * -0x3c < 0) {
    local_4 = mp_copy((mp_int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (mp_int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    local_4 = mp_copy((mp_int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (mp_int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (local_4 == 0) {
      for (iVar2 = in_ESI / 0x3c + (uint)(in_ESI % 0x3c != 0); iVar2 < in_RDX->used;
          iVar2 = iVar2 + 1) {
        in_RDX->dp[iVar2] = 0;
      }
      auVar1._8_4_ = 0;
      auVar1._0_8_ = (long)in_ESI;
      in_RDX->dp[in_ESI / 0x3c] =
           (1L << SUB121(auVar1 % ZEXT812(0x3c),0)) - 1U & in_RDX->dp[in_ESI / 0x3c];
      mp_clamp(in_RDX);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mp_mod_2d (mp_int * a, int b, mp_int * c)
{
  int     x, res;

  /* if b is <= 0 then zero the int */
  if (b <= 0) {
    mp_zero (c);
    return MP_OKAY;
  }

  /* if the modulus is larger than the value than return */
  if (b >= (int) (a->used * DIGIT_BIT)) {
    res = mp_copy (a, c);
    return res;
  }

  /* copy */
  if ((res = mp_copy (a, c)) != MP_OKAY) {
    return res;
  }

  /* zero digits above the last digit of the modulus */
  for (x = (b / DIGIT_BIT) + ((b % DIGIT_BIT) == 0 ? 0 : 1); x < c->used; x++) {
    c->dp[x] = 0;
  }
  /* clear the digit that is not completely outside/inside the modulus */
  c->dp[b / DIGIT_BIT] &=
    (mp_digit) ((((mp_digit) 1) << (((mp_digit) b) % DIGIT_BIT)) - ((mp_digit) 1));
  mp_clamp (c);
  return MP_OKAY;
}